

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void VP8LInitBitReader(VP8LBitReader *br,uint8_t *start,size_t length)

{
  vp8l_val_t value;
  size_t i;
  size_t length_local;
  uint8_t *start_local;
  VP8LBitReader *br_local;
  
  value = 0;
  br->len_ = length;
  br->val_ = 0;
  br->bit_pos_ = 0;
  br->eos_ = 0;
  length_local = length;
  if (8 < length) {
    length_local = 8;
  }
  for (i = 0; i < length_local; i = i + 1) {
    value = (ulong)start[i] << ((byte)(i << 3) & 0x3f) | value;
  }
  br->val_ = value;
  br->pos_ = length_local;
  br->buf_ = start;
  return;
}

Assistant:

void VP8LInitBitReader(VP8LBitReader* const br, const uint8_t* const start,
                       size_t length) {
  size_t i;
  vp8l_val_t value = 0;
  assert(br != NULL);
  assert(start != NULL);
  assert(length < 0xfffffff8u);   // can't happen with a RIFF chunk.

  br->len_ = length;
  br->val_ = 0;
  br->bit_pos_ = 0;
  br->eos_ = 0;

  if (length > sizeof(br->val_)) {
    length = sizeof(br->val_);
  }
  for (i = 0; i < length; ++i) {
    value |= (vp8l_val_t)start[i] << (8 * i);
  }
  br->val_ = value;
  br->pos_ = length;
  br->buf_ = start;
}